

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_x509a.cc
# Opt level: O2

int X509_keyid_set1(X509 *x,uchar *id,int len)

{
  ASN1_OCTET_STRING *a;
  int iVar1;
  X509_CERT_AUX *pXVar2;
  ASN1_OCTET_STRING *str;
  
  if (id == (uchar *)0x0) {
    iVar1 = 1;
    if (((x != (X509 *)0x0) && (x->altname != (stack_st_GENERAL_NAME *)0x0)) &&
       (a = (ASN1_OCTET_STRING *)(x->altname->stack).comp, a != (ASN1_OCTET_STRING *)0x0)) {
      ASN1_OCTET_STRING_free(a);
      (x->altname->stack).comp = (_func_257 *)0x0;
    }
  }
  else {
    pXVar2 = aux_get((X509 *)x);
    iVar1 = 0;
    if (pXVar2 != (X509_CERT_AUX *)0x0) {
      str = pXVar2->keyid;
      if (str == (ASN1_OCTET_STRING *)0x0) {
        str = (ASN1_OCTET_STRING *)ASN1_OCTET_STRING_new();
        pXVar2->keyid = str;
        if (str == (ASN1_OCTET_STRING *)0x0) {
          return 0;
        }
      }
      iVar1 = ASN1_STRING_set((ASN1_STRING *)str,id,len);
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

int X509_keyid_set1(X509 *x, const uint8_t *id, ossl_ssize_t len) {
  X509_CERT_AUX *aux;
  // TODO(davidben): Empty key IDs are not meaningful in PKCS#12, and the
  // getters cannot quite represent them. Also erase the object if |len| is
  // zero.
  if (!id) {
    if (!x || !x->aux || !x->aux->keyid) {
      return 1;
    }
    ASN1_OCTET_STRING_free(x->aux->keyid);
    x->aux->keyid = NULL;
    return 1;
  }
  if (!(aux = aux_get(x))) {
    return 0;
  }
  if (!aux->keyid && !(aux->keyid = ASN1_OCTET_STRING_new())) {
    return 0;
  }
  return ASN1_STRING_set(aux->keyid, id, len);
}